

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

unique_ptr<trompeloeil::expectation,_std::default_delete<trompeloeil::expectation>_> __thiscall
trompeloeil::call_validator_t<ExecutionCounter&>::operator+
          (call_validator_t<ExecutionCounter&> *this,
          call_modifier<trompeloeil::call_matcher<void_(),_std::tuple<>_>,_ExecutionCounter::trompeloeil_l_tag_type_trompeloeil_36,_trompeloeil::call_limit_injector<trompeloeil::matcher_info<void_()>,_1UL>_>
          *t)

{
  undefined8 in_RDX;
  integral_constant<bool,_true> tag;
  bool valid_return_type;
  bool forbidden;
  bool retmatch;
  call_modifier<trompeloeil::call_matcher<void_(),_std::tuple<>_>,_ExecutionCounter::trompeloeil_l_tag_type_trompeloeil_36,_trompeloeil::call_limit_injector<trompeloeil::matcher_info<void_()>,_1UL>_>
  *t_local;
  call_validator_t<ExecutionCounter_&> *this_local;
  
  make_expectation<trompeloeil::call_matcher<void(),std::tuple<>>,ExecutionCounter::trompeloeil_l_tag_type_trompeloeil_36,trompeloeil::call_limit_injector<trompeloeil::matcher_info<void()>,1ul>>
            (this,t,in_RDX);
  return (__uniq_ptr_data<trompeloeil::expectation,_std::default_delete<trompeloeil::expectation>,_true,_true>
          )(__uniq_ptr_data<trompeloeil::expectation,_std::default_delete<trompeloeil::expectation>,_true,_true>
            )this;
}

Assistant:

TROMPELOEIL_TRAILING_RETURN_TYPE(std::unique_ptr<expectation>)
    {
      using call = call_modifier<M, Tag, Info>;
      using sigret = return_of_t<typename call::signature>;
      using ret = typename call::return_type;
      constexpr bool retmatch = std::is_same<ret, sigret>::value;
      constexpr bool forbidden = call::upper_call_limit == 0;
      constexpr bool valid_return_type = call::throws || retmatch || forbidden;
      static_assert(valid_return_type, "RETURN missing for non-void function");
      auto tag = std::integral_constant<bool, valid_return_type>{};
      return make_expectation(tag, std::move(t));
    }